

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
::write_decimal<__int128>
          (arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
           *this,__int128 value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  uint uVar3;
  char *in_RDX;
  char *pcVar4;
  ulong in_RSI;
  buffer<char> *c;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char *in_stack_ffffffffffffffb8;
  
  pcVar8 = in_RDX;
  if ((long)in_RDX < 0) {
    bVar11 = in_RSI != 0;
    in_RSI = -in_RSI;
    pcVar8 = (char *)(-(ulong)bVar11 - (long)in_RDX);
  }
  auVar13._8_8_ = pcVar8;
  auVar13._0_8_ = in_RSI;
  uVar10 = 1;
  if ((char *)(ulong)(in_RSI < 10) <= pcVar8) {
    uVar3 = 4;
    auVar12 = auVar13;
    do {
      uVar10 = uVar3;
      uVar7 = auVar12._8_8_;
      uVar6 = auVar12._0_8_;
      if (uVar7 == 0 && (ulong)(99 < uVar6) <= -uVar7) {
        uVar10 = uVar10 - 2;
        goto LAB_00189c95;
      }
      if (uVar7 == 0 && (ulong)(999 < uVar6) <= -uVar7) {
        uVar10 = uVar10 - 1;
        goto LAB_00189c95;
      }
      if (uVar7 < (uVar6 < 10000)) goto LAB_00189c95;
      auVar12 = __udivti3(uVar6,uVar7,10000,0);
      uVar3 = uVar10 + 4;
    } while (uVar7 != 0 || -uVar7 < (ulong)(99999 < uVar6));
    uVar10 = uVar10 + 1;
  }
LAB_00189c95:
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar7 = ((long)(int)uVar10 - ((long)in_RDX >> 0x3f)) + sVar2;
  if (pbVar1->capacity_ < uVar7) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar7);
  }
  pcVar4 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar7;
  if ((long)in_RDX < 0) {
    *pcVar4 = '-';
    pcVar4 = pcVar4 + 1;
  }
  if ((int)uVar10 < 0) {
    assert_fail(in_RDX,0,in_stack_ffffffffffffffb8);
  }
  pcVar4 = pcVar4 + uVar10;
  pcVar5 = pcVar4;
  if ((char *)(ulong)(in_RSI < 100) <= pcVar8) {
    do {
      lVar9 = auVar13._8_8_;
      uVar7 = auVar13._0_8_;
      pcVar5 = pcVar4 + -2;
      auVar13 = __udivti3(uVar7,lVar9,100,0);
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar7 + auVar13._0_8_ * -100) * 2);
      pcVar4 = pcVar5;
    } while (lVar9 != 0 || (ulong)-lVar9 < (ulong)(9999 < uVar7));
  }
  if (auVar13._8_8_ == 0 && (ulong)(9 < auVar13._0_8_) <= (ulong)-auVar13._8_8_) {
    pcVar5[-1] = auVar13[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar5 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar13._0_8_ * 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }